

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.c
# Opt level: O1

TestReporter * create_reporter(void)

{
  TestReporter *__ptr;
  CgreenBreadcrumb *pCVar1;
  
  __ptr = (TestReporter *)malloc(0x98);
  if (__ptr != (TestReporter *)0x0) {
    pCVar1 = create_breadcrumb();
    if (pCVar1 != (CgreenBreadcrumb *)0x0) {
      __ptr->destroy = destroy_reporter;
      __ptr->start_suite = reporter_start_suite;
      __ptr->start_test = reporter_start_test;
      __ptr->show_pass = show_pass;
      __ptr->show_skip = show_skip;
      __ptr->show_fail = show_fail;
      __ptr->show_incomplete = show_incomplete;
      __ptr->assert_true = assert_true;
      __ptr->finish_test = reporter_finish_test;
      __ptr->finish_suite = reporter_finish_suite;
      __ptr->passes = 0;
      __ptr->failures = 0;
      __ptr->exceptions = 0;
      __ptr->skips = 0;
      __ptr->duration = 0;
      __ptr->total_passes = 0;
      __ptr->total_failures = 0;
      __ptr->total_exceptions = 0;
      __ptr->total_skips = 0;
      __ptr->total_duration = 0;
      __ptr->breadcrumb = pCVar1;
      __ptr->memo = (void *)0x0;
      __ptr->options = (void *)0x0;
      return __ptr;
    }
    free(__ptr);
  }
  return (TestReporter *)0x0;
}

Assistant:

TestReporter *create_reporter(void) {
    CgreenBreadcrumb *breadcrumb;
    TestReporter *reporter = (TestReporter *) malloc(sizeof(TestReporter));
    if (reporter == NULL) {
        return NULL;
    }

    breadcrumb = create_breadcrumb();
    if (breadcrumb == NULL) {
        free(reporter);
        return NULL;
    }

    reporter->destroy = &destroy_reporter;
    reporter->start_suite = &reporter_start_suite;
    reporter->start_test = &reporter_start_test;
    reporter->show_pass = &show_pass;
    reporter->show_skip = &show_skip;
    reporter->show_fail = &show_fail;
    reporter->show_incomplete = &show_incomplete;
    reporter->assert_true = &assert_true;
    reporter->finish_test = &reporter_finish_test;
    reporter->finish_suite = &reporter_finish_suite;
    reporter->passes = 0;
    reporter->skips = 0;
    reporter->failures = 0;
    reporter->exceptions = 0;
    reporter->duration = 0;
    reporter->total_passes = 0;
    reporter->total_skips = 0;
    reporter->total_failures = 0;
    reporter->total_exceptions = 0;
    reporter->total_duration = 0;
    reporter->breadcrumb = breadcrumb;
    reporter->memo = NULL;
    reporter->options = NULL;
    return reporter;
}